

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_int,int>::
Flush<duckdb::BitpackingCompressionState<unsigned_int,true,int>::BitpackingWriter>
          (BitpackingState<unsigned_int,int> *this)

{
  BitpackingState<unsigned_int,int> *values;
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint *values_00;
  idx_t iVar4;
  int iVar5;
  BitpackingState<unsigned_int,int> BVar6;
  uint32_t right;
  unsigned_long uVar7;
  long lVar8;
  uint value_1;
  uint uVar9;
  idx_t iVar10;
  bool bVar11;
  uint32_t left;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  
  bVar11 = true;
  if (*(idx_t *)(this + 0x4810) == 0) {
    return true;
  }
  if (this[0x4845] == (BitpackingState<unsigned_int,int>)0x0) {
    right = *(uint32_t *)(this + 0x4828);
    left = *(uint32_t *)(this + 0x482c);
    if (left != right) goto LAB_0172422c;
  }
  left = *(uint32_t *)(this + 0x482c);
  if ((byte)((char)this[0x4848] - 1U) < 2) {
    BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteConstant
              (left,*(idx_t *)(this + 0x4810),*(void **)(this + 0x4820),(bool)this[0x4845]);
    *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 8;
    return true;
  }
  right = *(uint32_t *)(this + 0x4828);
LAB_0172422c:
  BVar6 = (BitpackingState<unsigned_int,int>)
          TrySubtractOperator::Operation<unsigned_int,unsigned_int,unsigned_int>
                    (left,right,(uint32_t *)(this + 0x4830));
  this[0x4847] = BVar6;
  BitpackingState<unsigned_int,_int>::CalculateDeltaStats
            ((BitpackingState<unsigned_int,_int> *)this);
  if (this[0x4846] == (BitpackingState<unsigned_int,int>)0x1) {
    uVar9 = *(uint *)(this + 0x4834);
    if (((byte)this[0x4848] & 0xfe) != 4 && *(uint *)(this + 0x4838) == uVar9) {
      BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteConstantDelta
                (*(uint *)(this + 0x4838),**(uint **)(this + 0x2008),*(idx_t *)(this + 0x4810),
                 *(uint **)(this + 0x2008),(bool *)(this + 0x4010),*(void **)(this + 0x4820));
      *(long *)(this + 0x4818) = *(long *)(this + 0x4818) + 0xc;
      return true;
    }
    uVar2 = *(uint *)(this + 0x4830);
    uVar3 = *(uint *)(this + 0x483c);
    iVar5 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    bVar13 = 0x20 - ((byte)iVar5 ^ 0x1f);
    if (0xfffffff < uVar3) {
      bVar13 = 0x20;
    }
    if (uVar3 == 0) {
      bVar13 = 0;
    }
    iVar5 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    bVar12 = 0x20 - ((byte)iVar5 ^ 0x1f);
    if (0xfffffff < uVar2) {
      bVar12 = 0x20;
    }
    if ((this[0x4848] != (BitpackingState<unsigned_int,int>)0x5 && uVar2 != 0) && bVar13 < bVar12) {
      values = this + 0x2010;
      iVar4 = *(idx_t *)(this + 0x4810);
      if (iVar4 != 0) {
        iVar10 = 0;
        do {
          *(uint *)(values + iVar10 * 4) = *(int *)(values + iVar10 * 4) - uVar9;
          iVar10 = iVar10 + 1;
        } while (iVar4 != iVar10);
        uVar9 = *(uint *)(this + 0x4834);
      }
      BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteDeltaFor
                ((uint *)values,(bool *)(this + 0x4010),bVar13,uVar9,*(int *)(this + 0x4840),
                 *(uint **)(this + 0x2008),iVar4,*(void **)(this + 0x4820));
      uVar14 = *(ulong *)(this + 0x4810);
      lVar8 = *(long *)(this + 0x4818) + 0x10;
      *(long *)(this + 0x4818) = lVar8;
      if ((uVar14 & 0x1f) != 0) {
        uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar14 & 0x1f);
        uVar14 = (uVar14 - uVar7) + 0x20;
        lVar8 = *(long *)(this + 0x4818);
      }
      *(ulong *)(this + 0x4818) = (bVar13 * uVar14 >> 3) + lVar8;
      return true;
    }
  }
  if (this[0x4847] == (BitpackingState<unsigned_int,int>)0x1) {
    uVar9 = *(uint *)(this + 0x4830);
    iVar5 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    bVar13 = 0x20;
    if (uVar9 < 0x10000000) {
      bVar13 = 0x20 - ((byte)iVar5 ^ 0x1f);
    }
    if (uVar9 == 0) {
      bVar13 = 0;
    }
    values_00 = *(uint **)(this + 0x2008);
    uVar9 = *(uint *)(this + 0x4828);
    iVar4 = *(idx_t *)(this + 0x4810);
    if (iVar4 != 0) {
      iVar10 = 0;
      do {
        puVar1 = values_00 + iVar10;
        *puVar1 = *puVar1 - uVar9;
        iVar10 = iVar10 + 1;
      } while (iVar4 != iVar10);
      uVar9 = *(uint *)(this + 0x4828);
    }
    BitpackingCompressionState<unsigned_int,_true,_int>::BitpackingWriter::WriteFor
              (values_00,(bool *)(this + 0x4010),bVar13,uVar9,iVar4,*(void **)(this + 0x4820));
    uVar14 = *(ulong *)(this + 0x4810);
    if ((uVar14 & 0x1f) != 0) {
      uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar14 & 0x1f);
      uVar14 = (uVar14 - uVar7) + 0x20;
    }
    *(ulong *)(this + 0x4818) = *(long *)(this + 0x4818) + (bVar13 * uVar14 >> 3) + 0xc;
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}